

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::reverse_lexicographic_order
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Simplex_handle *sh1,
          Simplex_handle *sh2)

{
  Vertex_handle *this_00;
  type_conflict3 tVar1;
  reference rVar2;
  reference rVar3;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  SVar4;
  type_conflict3 local_175;
  type_conflict3 local_169;
  Siblings *local_128;
  Vertex_handle local_120;
  Siblings *local_118;
  Vertex_handle local_110;
  Siblings *local_108;
  Vertex_handle local_100;
  Siblings *local_f8;
  Vertex_handle local_f0;
  Siblings *local_e8;
  Vertex_handle local_e0;
  Siblings *local_d8;
  Vertex_handle local_d0;
  Siblings *local_c8;
  Vertex_handle local_c0;
  Siblings *local_b8;
  Vertex_handle local_b0;
  Siblings *local_a8;
  Simplex_vertex_iterator it2;
  Siblings *local_88;
  Simplex_vertex_iterator it1;
  undefined1 local_70 [8];
  Simplex_vertex_range rg2;
  undefined1 local_48 [8];
  Simplex_vertex_range rg1;
  Simplex_handle *sh2_local;
  Simplex_handle *sh1_local;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this_local;
  
  this_00 = &rg2.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End.v_;
  rg1.
  super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._8_8_ = sh2;
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                  *)this_00,sh1);
  simplex_vertex_range((Simplex_vertex_range *)local_48,this,(Simplex_handle *)this_00);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                  *)&it1.v_,sh2);
  simplex_vertex_range((Simplex_vertex_range *)local_70,this,(Simplex_handle *)&it1.v_);
  SVar4 = boost::iterator_range_detail::
          iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          ::begin((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                   *)local_48);
  it2._8_8_ = SVar4.sib_;
  it1.sib_._0_4_ = SVar4.v_;
  local_88 = (Siblings *)it2._8_8_;
  SVar4 = boost::iterator_range_detail::
          iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          ::begin((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                   *)local_70);
  local_b8 = SVar4.sib_;
  local_b0 = SVar4.v_;
  local_a8 = local_b8;
  it2.sib_._0_4_ = local_b0;
  while( true ) {
    SVar4 = boost::iterator_range_detail::
            iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
            ::end((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                   *)local_48);
    local_d8 = SVar4.sib_;
    local_d0 = SVar4.v_;
    local_c8 = local_d8;
    local_c0 = local_d0;
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                        *)&local_88,
                       (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                        *)&local_c8);
    local_169 = false;
    if (tVar1) {
      SVar4 = boost::iterator_range_detail::
              iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
              ::end((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                     *)local_70);
      local_f8 = SVar4.sib_;
      local_f0 = SVar4.v_;
      local_e8 = local_f8;
      local_e0 = local_f0;
      local_169 = boost::iterators::operator!=
                            ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                              *)&local_a8,
                             (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                              *)&local_e8);
    }
    if (local_169 == false) break;
    rVar2 = boost::iterators::detail::
            iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
            ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                         *)&local_88);
    rVar3 = boost::iterators::detail::
            iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
            ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                         *)&local_a8);
    if (rVar2 != rVar3) {
      rVar2 = boost::iterators::detail::
              iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                           *)&local_88);
      rVar3 = boost::iterators::detail::
              iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                           *)&local_a8);
      return rVar2 < rVar3;
    }
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                  *)&local_88);
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                  *)&local_a8);
  }
  SVar4 = boost::iterator_range_detail::
          iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          ::end((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                 *)local_48);
  local_118 = SVar4.sib_;
  local_110 = SVar4.v_;
  local_108 = local_118;
  local_100 = local_110;
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                      *)&local_88,
                     (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                      *)&local_108);
  local_175 = false;
  if (tVar1) {
    SVar4 = boost::iterator_range_detail::
            iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
            ::end((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                   *)local_70);
    local_128 = SVar4.sib_;
    local_120 = SVar4.v_;
    local_175 = boost::iterators::operator!=
                          ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                            *)&local_a8,
                           (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                            *)&local_128);
  }
  return local_175;
}

Assistant:

bool reverse_lexicographic_order(Simplex_handle sh1, Simplex_handle sh2) const {
    Simplex_vertex_range rg1 = simplex_vertex_range(sh1);
    Simplex_vertex_range rg2 = simplex_vertex_range(sh2);
    Simplex_vertex_iterator it1 = rg1.begin();
    Simplex_vertex_iterator it2 = rg2.begin();
    while (it1 != rg1.end() && it2 != rg2.end()) {
      if (*it1 == *it2) {
        ++it1;
        ++it2;
      } else {
        return *it1 < *it2;
      }
    }
    return ((it1 == rg1.end()) && (it2 != rg2.end()));
  }